

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

void __thiscall ClipperLib::Clipper::ProcessHorizontal(Clipper *this,TEdge *horzEdge)

{
  MaximaList *pMVar1;
  double dVar2;
  int iVar3;
  TEdge *pTVar4;
  _List_node_base *p_Var5;
  long lVar6;
  _List_node_base *p_Var7;
  bool bVar8;
  int iVar9;
  TEdge **ppTVar10;
  long *plVar11;
  OutPt *pOVar12;
  OutPt *op2;
  long lVar13;
  TEdge *pTVar14;
  _Self __tmp;
  _List_node_base *p_Var15;
  long lVar16;
  TEdge *pTVar17;
  long lVar18;
  long lVar19;
  _List_node_base *p_Var20;
  TEdge *pTVar21;
  IntPoint OffPt;
  IntPoint OffPt_00;
  IntPoint Pt;
  TEdge *local_98;
  TEdge *local_88;
  IntPoint local_80;
  OutPt *local_70;
  size_t *local_68;
  long local_60;
  long local_58;
  IntPoint *local_50;
  TEdge **local_48;
  TEdge *local_40;
  long local_38;
  
  ppTVar10 = &local_88;
  local_88 = horzEdge;
  iVar3 = horzEdge->WindDelta;
  lVar16 = (horzEdge->Bot).X;
  lVar13 = (horzEdge->Top).X;
  bVar8 = lVar16 < lVar13;
  local_60 = lVar13;
  if (lVar16 < lVar13) {
    local_60 = lVar16;
  }
  local_58 = lVar13;
  if (lVar13 < lVar16) {
    local_58 = lVar16;
  }
  do {
    pTVar4 = *ppTVar10;
    pTVar21 = pTVar4->NextInLML;
    if (pTVar21 == (TEdge *)0x0) goto LAB_00112144;
    ppTVar10 = &pTVar4->NextInLML;
  } while ((pTVar21->Dx == -1e+40) && (!NAN(pTVar21->Dx)));
  if (pTVar21 == (TEdge *)0x0) {
LAB_00112144:
    local_98 = GetMaximaPair(pTVar4);
  }
  else {
    local_98 = (TEdge *)0x0;
  }
  pMVar1 = &this->m_Maxima;
  if ((this->m_Maxima).super__List_base<long_long,_std::allocator<long_long>_>._M_impl._M_node.
      _M_size == 0) {
    p_Var20 = (_List_node_base *)0x0;
    p_Var15 = (_List_node_base *)0x0;
  }
  else if (lVar16 < lVar13) {
    p_Var20 = (_List_node_base *)0x0;
    p_Var15 = (_List_node_base *)pMVar1;
    do {
      p_Var15 = (((_List_base<long_long,_std::allocator<long_long>_> *)&p_Var15->_M_next)->_M_impl).
                _M_node.super__List_node_base._M_next;
      if (p_Var15 == (_List_node_base *)pMVar1) goto LAB_001121da;
    } while ((long)p_Var15[1]._M_next <= lVar16);
    if ((p_Var15 != (_List_node_base *)pMVar1) && ((pTVar4->Top).X <= (long)p_Var15[1]._M_next)) {
      p_Var15 = (_List_node_base *)pMVar1;
    }
    p_Var20 = (_List_node_base *)0x0;
  }
  else {
    p_Var5 = (pMVar1->super__List_base<long_long,_std::allocator<long_long>_>)._M_impl._M_node.
             super__List_node_base._M_next;
    p_Var15 = (_List_node_base *)0x0;
    p_Var7 = (_List_node_base *)pMVar1;
    do {
      p_Var20 = p_Var7;
      if (p_Var20 == p_Var5) goto LAB_001121da;
      p_Var7 = p_Var20->_M_prev;
    } while (lVar16 < (long)p_Var20->_M_prev[1]._M_next);
    if ((p_Var20 != p_Var5) && ((long)p_Var20->_M_prev[1]._M_next <= (pTVar4->Top).X)) {
      p_Var20 = p_Var5;
    }
    p_Var15 = (_List_node_base *)0x0;
  }
LAB_001121da:
  local_68 = &(this->m_Maxima).super__List_base<long_long,_std::allocator<long_long>_>._M_impl.
              _M_node._M_size;
  local_48 = &local_98->NextInAEL;
  local_70 = (OutPt *)0x0;
  local_40 = pTVar4;
  do {
    pTVar4 = local_88;
    if ((&local_88->NextInAEL)[!bVar8] != (TEdge *)0x0) {
      local_38 = (ulong)!bVar8 * 8 + 0x68;
      local_50 = &local_88->Top;
      pTVar21 = (&local_88->NextInAEL)[!bVar8];
      while( true ) {
        if ((this->m_Maxima).super__List_base<long_long,_std::allocator<long_long>_>._M_impl._M_node
            ._M_size != 0) {
          if (bVar8) {
            for (; (p_Var15 != (_List_node_base *)pMVar1 &&
                   ((long)p_Var15[1]._M_next < (pTVar21->Curr).X)); p_Var15 = p_Var15->_M_next) {
              if (-1 < pTVar4->OutIdx && iVar3 != 0) {
                local_80.Y = (pTVar4->Bot).Y;
                local_80.X = (cInt)p_Var15[1]._M_next;
                AddOutPt(this,pTVar4,&local_80);
              }
            }
          }
          else {
            while ((p_Var20 !=
                    (pMVar1->super__List_base<long_long,_std::allocator<long_long>_>)._M_impl.
                    _M_node.super__List_node_base._M_next &&
                   ((pTVar21->Curr).X < (long)p_Var20->_M_prev[1]._M_next))) {
              if (-1 < pTVar4->OutIdx && iVar3 != 0) {
                local_80.X = (cInt)p_Var20->_M_prev[1]._M_next;
                local_80.Y = (pTVar4->Bot).Y;
                AddOutPt(this,pTVar4,&local_80);
              }
              p_Var20 = p_Var20->_M_prev;
            }
          }
        }
        if ((((bVar8) && (local_58 < (pTVar21->Curr).X)) ||
            ((!bVar8 && ((pTVar21->Curr).X < local_60)))) ||
           ((((pTVar21->Curr).X == local_50->X && (pTVar4->NextInLML != (TEdge *)0x0)) &&
            (dVar2 = pTVar4->NextInLML->Dx, pTVar21->Dx <= dVar2 && dVar2 != pTVar21->Dx)))) break;
        if (-1 < pTVar4->OutIdx && iVar3 != 0) {
          local_70 = AddOutPt(this,pTVar4,&pTVar21->Curr);
          for (pTVar14 = this->m_SortedEdges; pTVar14 != (TEdge *)0x0; pTVar14 = pTVar14->NextInSEL)
          {
            if (-1 < (long)pTVar14->OutIdx) {
              lVar16 = (pTVar4->Bot).X;
              lVar13 = (pTVar4->Top).X;
              lVar18 = (pTVar14->Bot).X;
              lVar6 = (pTVar14->Top).X;
              lVar19 = lVar13;
              if (lVar16 < lVar13) {
                lVar19 = lVar16;
              }
              if (lVar13 < lVar16) {
                lVar13 = lVar16;
              }
              lVar16 = lVar6;
              if (lVar18 < lVar6) {
                lVar16 = lVar18;
              }
              if (lVar18 <= lVar6) {
                lVar18 = lVar6;
              }
              if ((lVar19 < lVar18) && (lVar16 < lVar13)) {
                plVar11 = (long *)(*(long *)(*(long *)((long)&this->m_ClipType +
                                                      (long)this->_vptr_Clipper[-3]) +
                                            (long)pTVar14->OutIdx * 8) + 0x18);
                if (pTVar14->Side != esLeft) {
                  plVar11 = (long *)(*plVar11 + 0x20);
                }
                OffPt.Y = (pTVar14->Top).Y;
                OffPt.X = lVar6;
                AddJoin(this,(OutPt *)*plVar11,local_70,OffPt);
              }
            }
          }
          AddGhostJoin(this,local_70,pTVar4->Bot);
        }
        if ((pTVar4 == local_40) && (pTVar21 == local_98)) {
          if (-1 < pTVar4->OutIdx) {
            AddLocalMaxPoly(this,pTVar4,local_98,local_50);
          }
          pTVar21 = pTVar4->NextInAEL;
          pTVar14 = pTVar4->PrevInAEL;
          if (((pTVar14 != (TEdge *)0x0) || (pTVar21 != (TEdge *)0x0)) ||
             (*(TEdge **)
               (this->_vptr_Clipper[-3] + 0x10 +
               (long)&(this->m_Maxima).super__List_base<long_long,_std::allocator<long_long>_>) ==
              pTVar4)) {
            ppTVar10 = &pTVar14->NextInAEL;
            if (pTVar14 == (TEdge *)0x0) {
              ppTVar10 = (TEdge **)(this->_vptr_Clipper[-3] + (long)local_68);
            }
            *ppTVar10 = pTVar21;
            if (pTVar21 != (TEdge *)0x0) {
              pTVar21->PrevInAEL = pTVar14;
            }
            pTVar4->NextInAEL = (TEdge *)0x0;
            pTVar4->PrevInAEL = (TEdge *)0x0;
          }
          pTVar4 = local_98->NextInAEL;
          pTVar21 = local_98->PrevInAEL;
          iVar9 = 1;
          if (((pTVar21 != (TEdge *)0x0) || (pTVar4 != (TEdge *)0x0)) ||
             (*(TEdge **)
               (this->_vptr_Clipper[-3] + 0x10 +
               (long)&(this->m_Maxima).super__List_base<long_long,_std::allocator<long_long>_>) ==
              local_98)) {
            ppTVar10 = &pTVar21->NextInAEL;
            if (pTVar21 == (TEdge *)0x0) {
              ppTVar10 = (TEdge **)(this->_vptr_Clipper[-3] + (long)local_68);
            }
            *ppTVar10 = pTVar4;
            if (pTVar4 != (TEdge *)0x0) {
              pTVar4->PrevInAEL = pTVar21;
            }
            *local_48 = (TEdge *)0x0;
            local_48[1] = (TEdge *)0x0;
          }
          goto LAB_001125ee;
        }
        if (bVar8) {
          local_80.X = (pTVar21->Curr).X;
          local_80.Y = (pTVar4->Curr).Y;
          pTVar14 = pTVar21;
          pTVar17 = pTVar4;
        }
        else {
          local_80.X = (pTVar21->Curr).X;
          local_80.Y = (pTVar4->Curr).Y;
          pTVar14 = pTVar4;
          pTVar17 = pTVar21;
        }
        IntersectEdges(this,pTVar17,pTVar14,&local_80);
        pTVar14 = *(TEdge **)((long)&(pTVar21->Bot).X + local_38);
        ClipperBase::SwapPositionsInAEL
                  ((ClipperBase *)((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]),
                   pTVar4,pTVar21);
        pTVar21 = pTVar14;
        if (pTVar14 == (TEdge *)0x0) break;
      }
    }
    iVar9 = 8;
    if (((pTVar4->NextInLML != (TEdge *)0x0) && (dVar2 = pTVar4->NextInLML->Dx, dVar2 == -1e+40)) &&
       (!NAN(dVar2))) {
      ClipperBase::UpdateEdgeIntoAEL
                ((ClipperBase *)((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]),
                 &local_88);
      pTVar4 = local_88;
      if (-1 < local_88->OutIdx) {
        AddOutPt(this,local_88,&local_88->Bot);
      }
      lVar16 = (pTVar4->Bot).X;
      local_58 = (pTVar4->Top).X;
      local_60 = local_58;
      if (lVar16 < local_58) {
        local_60 = lVar16;
      }
      bVar8 = lVar16 < local_58;
      if (local_58 < lVar16) {
        local_58 = lVar16;
      }
      iVar9 = 0;
    }
LAB_001125ee:
    pTVar4 = local_88;
    if (iVar9 != 0) {
      if (iVar9 == 8) {
        if ((-1 < (long)local_88->OutIdx) && (local_70 == (OutPt *)0x0)) {
          plVar11 = (long *)(*(long *)(*(long *)((long)&this->m_ClipType +
                                                (long)this->_vptr_Clipper[-3]) +
                                      (long)local_88->OutIdx * 8) + 0x18);
          if (local_88->Side != esLeft) {
            plVar11 = (long *)(*plVar11 + 0x20);
          }
          pOVar12 = (OutPt *)*plVar11;
          for (pTVar21 = this->m_SortedEdges; pTVar21 != (TEdge *)0x0; pTVar21 = pTVar21->NextInSEL)
          {
            if (-1 < (long)pTVar21->OutIdx) {
              lVar16 = (pTVar4->Bot).X;
              lVar13 = (pTVar4->Top).X;
              lVar18 = (pTVar21->Bot).X;
              lVar6 = (pTVar21->Top).X;
              lVar19 = lVar13;
              if (lVar16 < lVar13) {
                lVar19 = lVar16;
              }
              if (lVar13 < lVar16) {
                lVar13 = lVar16;
              }
              lVar16 = lVar6;
              if (lVar18 < lVar6) {
                lVar16 = lVar18;
              }
              if (lVar18 <= lVar6) {
                lVar18 = lVar6;
              }
              if ((lVar19 < lVar18) && (lVar16 < lVar13)) {
                plVar11 = (long *)(*(long *)(*(long *)((long)&this->m_ClipType +
                                                      (long)this->_vptr_Clipper[-3]) +
                                            (long)pTVar21->OutIdx * 8) + 0x18);
                if (pTVar21->Side != esLeft) {
                  plVar11 = (long *)(*plVar11 + 0x20);
                }
                OffPt_00.Y = (pTVar21->Top).Y;
                OffPt_00.X = lVar6;
                AddJoin(this,(OutPt *)*plVar11,pOVar12,OffPt_00);
              }
            }
          }
          AddGhostJoin(this,pOVar12,pTVar4->Top);
        }
        if (pTVar4->NextInLML == (TEdge *)0x0) {
          if (-1 < pTVar4->OutIdx) {
            AddOutPt(this,pTVar4,&pTVar4->Top);
          }
          pTVar21 = pTVar4->NextInAEL;
          pTVar14 = pTVar4->PrevInAEL;
          if (((pTVar14 != (TEdge *)0x0) || (pTVar21 != (TEdge *)0x0)) ||
             (*(TEdge **)
               (this->_vptr_Clipper[-3] + 0x10 +
               (long)&(this->m_Maxima).super__List_base<long_long,_std::allocator<long_long>_>) ==
              pTVar4)) {
            pTVar17 = pTVar14;
            if (pTVar14 == (TEdge *)0x0) {
              pTVar17 = (TEdge *)((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]);
            }
            pTVar17->NextInAEL = pTVar21;
            if (pTVar21 != (TEdge *)0x0) {
              pTVar21->PrevInAEL = pTVar14;
            }
            pTVar4->NextInAEL = (TEdge *)0x0;
            pTVar4->PrevInAEL = (TEdge *)0x0;
          }
        }
        else if (pTVar4->OutIdx < 0) {
          ClipperBase::UpdateEdgeIntoAEL
                    ((ClipperBase *)((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]),
                     &local_88);
        }
        else {
          pOVar12 = AddOutPt(this,pTVar4,&pTVar4->Top);
          ClipperBase::UpdateEdgeIntoAEL
                    ((ClipperBase *)((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]),
                     &local_88);
          pTVar4 = local_88;
          if (local_88->WindDelta != 0) {
            pTVar21 = local_88->NextInAEL;
            pTVar14 = local_88->PrevInAEL;
            if ((((((pTVar14 != (TEdge *)0x0) && ((pTVar14->Curr).X == (local_88->Bot).X)) &&
                  ((lVar16 = (pTVar14->Curr).Y, lVar16 == (local_88->Bot).Y &&
                   ((pTVar14->WindDelta != 0 && (-1 < pTVar14->OutIdx)))))) &&
                 ((pTVar14->Top).Y < lVar16)) &&
                (bVar8 = SlopesEqual(local_88,pTVar14,
                                     (bool)(this->_vptr_Clipper[-3] + 8)
                                           [(long)&(this->m_GhostJoins).
                                                                                                      
                                                  super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>
                                           ]), bVar8)) ||
               (((((pTVar21 != (TEdge *)0x0 && ((pTVar21->Curr).X == (pTVar4->Bot).X)) &&
                  (lVar16 = (pTVar21->Curr).Y, lVar16 == (pTVar4->Bot).Y)) &&
                 ((pTVar21->WindDelta != 0 && (-1 < pTVar21->OutIdx)))) &&
                (((pTVar21->Top).Y < lVar16 &&
                 (bVar8 = SlopesEqual(pTVar4,pTVar21,
                                      (bool)(this->_vptr_Clipper[-3] + 8)
                                            [(long)&(this->m_GhostJoins).
                                                                                                        
                                                  super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>
                                            ]), pTVar14 = pTVar21, bVar8)))))) {
              op2 = AddOutPt(this,pTVar14,&pTVar4->Bot);
              AddJoin(this,pOVar12,op2,pTVar4->Top);
              return;
            }
          }
        }
      }
      return;
    }
  } while( true );
}

Assistant:

void Clipper::ProcessHorizontal(TEdge *horzEdge)
{
  Direction dir;
  cInt horzLeft, horzRight;
  bool IsOpen = (horzEdge->WindDelta == 0);

  GetHorzDirection(*horzEdge, dir, horzLeft, horzRight);

  TEdge* eLastHorz = horzEdge, *eMaxPair = 0;
  while (eLastHorz->NextInLML && IsHorizontal(*eLastHorz->NextInLML)) 
    eLastHorz = eLastHorz->NextInLML;
  if (!eLastHorz->NextInLML)
    eMaxPair = GetMaximaPair(eLastHorz);

  MaximaList::const_iterator maxIt;
  MaximaList::const_reverse_iterator maxRit;
  if (m_Maxima.size() > 0)
  {
      //get the first maxima in range (X) ...
      if (dir == dLeftToRight)
      {
          maxIt = m_Maxima.begin();
          while (maxIt != m_Maxima.end() && *maxIt <= horzEdge->Bot.X) maxIt++;
          if (maxIt != m_Maxima.end() && *maxIt >= eLastHorz->Top.X)
              maxIt = m_Maxima.end();
      }
      else
      {
          maxRit = m_Maxima.rbegin();
          while (maxRit != m_Maxima.rend() && *maxRit > horzEdge->Bot.X) maxRit++;
          if (maxRit != m_Maxima.rend() && *maxRit <= eLastHorz->Top.X)
              maxRit = m_Maxima.rend();
      }
  }

  OutPt* op1 = 0;

  for (;;) //loop through consec. horizontal edges
  {
		  
    bool IsLastHorz = (horzEdge == eLastHorz);
    TEdge* e = GetNextInAEL(horzEdge, dir);
    while(e)
    {

        //this code block inserts extra coords into horizontal edges (in output
        //polygons) whereever maxima touch these horizontal edges. This helps
        //'simplifying' polygons (ie if the Simplify property is set).
        if (m_Maxima.size() > 0)
        {
            if (dir == dLeftToRight)
            {
                while (maxIt != m_Maxima.end() && *maxIt < e->Curr.X) 
                {
                  if (horzEdge->OutIdx >= 0 && !IsOpen)
                    AddOutPt(horzEdge, IntPoint(*maxIt, horzEdge->Bot.Y));
                  maxIt++;
                }
            }
            else
            {
                while (maxRit != m_Maxima.rend() && *maxRit > e->Curr.X)
                {
                  if (horzEdge->OutIdx >= 0 && !IsOpen)
                    AddOutPt(horzEdge, IntPoint(*maxRit, horzEdge->Bot.Y));
                  maxRit++;
                }
            }
        };

        if ((dir == dLeftToRight && e->Curr.X > horzRight) ||
			(dir == dRightToLeft && e->Curr.X < horzLeft)) break;

		//Also break if we've got to the end of an intermediate horizontal edge ...
		//nb: Smaller Dx's are to the right of larger Dx's ABOVE the horizontal.
		if (e->Curr.X == horzEdge->Top.X && horzEdge->NextInLML && 
			e->Dx < horzEdge->NextInLML->Dx) break;

    if (horzEdge->OutIdx >= 0 && !IsOpen)  //note: may be done multiple times
		{
#ifdef use_xyz
			if (dir == dLeftToRight) SetZ(e->Curr, *horzEdge, *e);
			else SetZ(e->Curr, *e, *horzEdge);
#endif      
			op1 = AddOutPt(horzEdge, e->Curr);
			TEdge* eNextHorz = m_SortedEdges;
			while (eNextHorz)
			{
				if (eNextHorz->OutIdx >= 0 &&
					HorzSegmentsOverlap(horzEdge->Bot.X,
					horzEdge->Top.X, eNextHorz->Bot.X, eNextHorz->Top.X))
				{
                    OutPt* op2 = GetLastOutPt(eNextHorz);
                    AddJoin(op2, op1, eNextHorz->Top);
				}
				eNextHorz = eNextHorz->NextInSEL;
			}
			AddGhostJoin(op1, horzEdge->Bot);
		}
		
		//OK, so far we're still in range of the horizontal Edge  but make sure
        //we're at the last of consec. horizontals when matching with eMaxPair
        if(e == eMaxPair && IsLastHorz)
        {
          if (horzEdge->OutIdx >= 0)
            AddLocalMaxPoly(horzEdge, eMaxPair, horzEdge->Top);
          DeleteFromAEL(horzEdge);
          DeleteFromAEL(eMaxPair);
          return;
        }
        
		if(dir == dLeftToRight)
        {
          IntPoint Pt = IntPoint(e->Curr.X, horzEdge->Curr.Y);
          IntersectEdges(horzEdge, e, Pt);
        }
        else
        {
          IntPoint Pt = IntPoint(e->Curr.X, horzEdge->Curr.Y);
          IntersectEdges( e, horzEdge, Pt);
        }
        TEdge* eNext = GetNextInAEL(e, dir);
        SwapPositionsInAEL( horzEdge, e );
        e = eNext;
    } //end while(e)

	//Break out of loop if HorzEdge.NextInLML is not also horizontal ...
	if (!horzEdge->NextInLML || !IsHorizontal(*horzEdge->NextInLML)) break;

	UpdateEdgeIntoAEL(horzEdge);
    if (horzEdge->OutIdx >= 0) AddOutPt(horzEdge, horzEdge->Bot);
    GetHorzDirection(*horzEdge, dir, horzLeft, horzRight);

  } //end for (;;)

  if (horzEdge->OutIdx >= 0 && !op1)
  {
      op1 = GetLastOutPt(horzEdge);
      TEdge* eNextHorz = m_SortedEdges;
      while (eNextHorz)
      {
          if (eNextHorz->OutIdx >= 0 &&
              HorzSegmentsOverlap(horzEdge->Bot.X,
              horzEdge->Top.X, eNextHorz->Bot.X, eNextHorz->Top.X))
          {
              OutPt* op2 = GetLastOutPt(eNextHorz);
              AddJoin(op2, op1, eNextHorz->Top);
          }
          eNextHorz = eNextHorz->NextInSEL;
      }
      AddGhostJoin(op1, horzEdge->Top);
  }

  if (horzEdge->NextInLML)
  {
    if(horzEdge->OutIdx >= 0)
    {
      op1 = AddOutPt( horzEdge, horzEdge->Top);
      UpdateEdgeIntoAEL(horzEdge);
      if (horzEdge->WindDelta == 0) return;
      //nb: HorzEdge is no longer horizontal here
      TEdge* ePrev = horzEdge->PrevInAEL;
      TEdge* eNext = horzEdge->NextInAEL;
      if (ePrev && ePrev->Curr.X == horzEdge->Bot.X &&
        ePrev->Curr.Y == horzEdge->Bot.Y && ePrev->WindDelta != 0 &&
        (ePrev->OutIdx >= 0 && ePrev->Curr.Y > ePrev->Top.Y &&
        SlopesEqual(*horzEdge, *ePrev, m_UseFullRange)))
      {
        OutPt* op2 = AddOutPt(ePrev, horzEdge->Bot);
        AddJoin(op1, op2, horzEdge->Top);
      }
      else if (eNext && eNext->Curr.X == horzEdge->Bot.X &&
        eNext->Curr.Y == horzEdge->Bot.Y && eNext->WindDelta != 0 &&
        eNext->OutIdx >= 0 && eNext->Curr.Y > eNext->Top.Y &&
        SlopesEqual(*horzEdge, *eNext, m_UseFullRange))
      {
        OutPt* op2 = AddOutPt(eNext, horzEdge->Bot);
        AddJoin(op1, op2, horzEdge->Top);
      }
    }
    else
      UpdateEdgeIntoAEL(horzEdge); 
  }
  else
  {
    if (horzEdge->OutIdx >= 0) AddOutPt(horzEdge, horzEdge->Top);
    DeleteFromAEL(horzEdge);
  }
}